

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O0

int Saig_ManRetimeSteps(Aig_Man_t *p,int nSteps,int fForward,int fAddBugs)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  bool local_45;
  int local_3c;
  int local_38;
  int i;
  int s;
  int RetValue;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  int fAddBugs_local;
  int fForward_local;
  int nSteps_local;
  Aig_Man_t *p_local;
  
  Aig_ManSetCioIds(p);
  Aig_ManFanoutStart(p);
  p->fCreatePios = 1;
  if (fForward == 0) {
    for (local_38 = 0; local_38 < nSteps; local_38 = local_38 + 1) {
      for (local_3c = 0; iVar1 = Saig_ManRegNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
        p_00 = p->vCis;
        iVar1 = Saig_ManPiNum(p);
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_3c + iVar1);
        pAVar3 = Saig_ManRetimeNodeBwd(p,pAVar2);
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          Aig_ObjReplace(p,pAVar2,pAVar3,0);
          break;
        }
      }
      iVar1 = Vec_PtrSize(p->vObjs);
      if (local_3c == iVar1) break;
    }
  }
  else {
    Saig_ManMarkAutonomous(p);
    for (local_38 = 0; local_38 < nSteps; local_38 = local_38 + 1) {
      for (local_3c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_3c);
        if ((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) {
          local_45 = fAddBugs != 0 && local_38 == 10;
          pAVar3 = Saig_ManRetimeNodeFwd(p,pAVar2,(uint)local_45);
          if (pAVar3 != (Aig_Obj_t *)0x0) {
            Aig_ObjReplace(p,pAVar2,pAVar3,0);
            break;
          }
        }
      }
      iVar1 = Vec_PtrSize(p->vObjs);
      if (local_3c == iVar1) break;
    }
  }
  p->fCreatePios = 0;
  Aig_ManFanoutStop(p);
  iVar1 = Aig_ManCleanup(p);
  if (iVar1 != 0) {
    __assert_fail("RetValue == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetStep.c"
                  ,0xe1,"int Saig_ManRetimeSteps(Aig_Man_t *, int, int, int)");
  }
  Aig_ManSetRegNum(p,p->nRegs);
  return local_38;
}

Assistant:

int Saig_ManRetimeSteps( Aig_Man_t * p, int nSteps, int fForward, int fAddBugs )
{
    Aig_Obj_t * pObj, * pObjNew;
    int RetValue, s, i;
    Aig_ManSetCioIds( p );
    Aig_ManFanoutStart( p );
    p->fCreatePios = 1;
    if ( fForward )
    {
        Saig_ManMarkAutonomous( p );
        for ( s = 0; s < nSteps; s++ )
        {
            Aig_ManForEachNode( p, pObj, i )
            {
                pObjNew = Saig_ManRetimeNodeFwd( p, pObj, fAddBugs && (s == 10) );
//                pObjNew = Saig_ManRetimeNodeFwd( p, pObj, 0 );
                if ( pObjNew == NULL )
                    continue;
                Aig_ObjReplace( p, pObj, pObjNew, 0 );
                break;
            }
            if ( i == Vec_PtrSize(p->vObjs) )
                break;
        }
    }
    else
    {
        for ( s = 0; s < nSteps; s++ )
        {
            Saig_ManForEachLo( p, pObj, i )
            {
                pObjNew = Saig_ManRetimeNodeBwd( p, pObj );
                if ( pObjNew == NULL )
                    continue;
                Aig_ObjReplace( p, pObj, pObjNew, 0 );
                break;
            }
            if ( i == Vec_PtrSize(p->vObjs) )
                break;
        }
    }
    p->fCreatePios = 0;
    Aig_ManFanoutStop( p );
    RetValue = Aig_ManCleanup( p );
    assert( RetValue == 0 );
    Aig_ManSetRegNum( p, p->nRegs ); 
    return s;
}